

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QOpenFileLineEdit.h
# Opt level: O3

void __thiscall QOpenFileLineEdit::~QOpenFileLineEdit(QOpenFileLineEdit *this)

{
  QAbstractButtonLineEditPrivate **this_00;
  
  this_00 = &this[-1].super_QAbstractButtonLineEdit.d;
  QLineEdit::~QLineEdit((QLineEdit *)this_00);
  operator_delete(this_00,0x38);
  return;
}

Assistant:

class QT_WIDGETS_EXTRA_QT_WIDGETS_EXTRA_LIB_EXPORT QOpenFileLineEdit : public QAbstractButtonLineEdit {
    Q_OBJECT
    class QOpenFileLineEditPrivate *d;

    Q_PROPERTY(QLineEdit::ActionPosition embededActionPosition READ embededActionPosition WRITE setEmbededActionPosition
                   NOTIFY embededActionPositionChanged)
    Q_PROPERTY(QString filePath READ filePath WRITE setFilePath USER true NOTIFY filePathChanged)
    Q_PROPERTY(QString caption READ caption WRITE setCaption)
    Q_PROPERTY(QString directory READ directory WRITE setDirectory)
    Q_PROPERTY(QStringList filter READ filter WRITE setFilter)
    Q_PROPERTY(QFileDialog::Options options READ options WRITE setOptions)

public:
    explicit QOpenFileLineEdit(QWidget *parent = nullptr);

    QLineEdit::ActionPosition embededActionPosition() const;
    void setEmbededActionPosition(QLineEdit::ActionPosition position);

    QString filePath() const;
    void setFilePath(const QString &filePath);

    QString caption() const;
    void setCaption(const QString &caption);

    QString directory() const;
    void setDirectory(const QString &directory);

    QStringList filter() const;
    void setFilter(const QStringList &filter);

    QFileDialog::Options options() const;
    void setOptions(QFileDialog::Options options);

Q_SIGNALS:
    void embededActionPositionChanged(QLineEdit::ActionPosition position);
    void filePathChanged(const QString &filePath);

private:
    using QAbstractButtonLineEdit::text;
    using QAbstractButtonLineEdit::setText;
}